

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::AddInitialRange
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Iterator *first,Iterator *last)

{
  bool bVar1;
  ostream *poVar2;
  value_type local_98;
  S2CellId local_8c;
  value_type local_84 [3];
  byte local_69;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55;
  uint64 local_54;
  S2CellId local_4c;
  int local_44;
  S2ShapeIndexCell *pSStack_40;
  int level;
  value_type local_38;
  uint64 local_30;
  S2CellId local_28;
  Iterator *local_20;
  Iterator *last_local;
  Iterator *first_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  local_20 = last;
  last_local = first;
  first_local = (Iterator *)this;
  local_28 = S2ShapeIndex::Iterator::id(first);
  local_30 = (uint64)S2ShapeIndex::Iterator::id(local_20);
  bVar1 = ::operator==(local_28,(S2CellId)local_30);
  if (bVar1) {
    local_38.id_ = (uint64)S2ShapeIndex::Iterator::id(last_local);
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(&this->index_covering_,&local_38);
    pSStack_40 = S2ShapeIndex::Iterator::cell(last_local);
    absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
    push_back(&this->index_cells_,&stack0xffffffffffffffc0);
  }
  else {
    local_4c = S2ShapeIndex::Iterator::id(last_local);
    local_54 = (uint64)S2ShapeIndex::Iterator::id(local_20);
    local_44 = S2CellId::GetCommonAncestorLevel(&local_4c,(S2CellId)local_54);
    local_69 = 0;
    if (local_44 < 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x343,kFatal,(ostream *)&std::cerr);
      local_69 = 1;
      poVar2 = S2LogMessage::stream(&local_68);
      poVar2 = std::operator<<(poVar2,"Check failed: (level) >= (0) ");
      S2LogMessageVoidify::operator&(&local_55,poVar2);
    }
    if ((local_69 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
    }
    local_8c = S2ShapeIndex::Iterator::id(last_local);
    local_84[0].id_ = (uint64)S2CellId::parent(&local_8c,local_44);
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(&this->index_covering_,local_84);
    local_98 = (value_type)0x0;
    absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
    push_back(&this->index_cells_,&local_98);
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::AddInitialRange(
    const S2ShapeIndex::Iterator& first,
    const S2ShapeIndex::Iterator& last) {
  if (first.id() == last.id()) {
    // The range consists of a single index cell.
    index_covering_.push_back(first.id());
    index_cells_.push_back(&first.cell());
  } else {
    // Add the lowest common ancestor of the given range.
    int level = first.id().GetCommonAncestorLevel(last.id());
    S2_DCHECK_GE(level, 0);
    index_covering_.push_back(first.id().parent(level));
    index_cells_.push_back(nullptr);
  }
}